

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O0

void eAX_Iv(PDISASM pMyDisasm)

{
  int iVar1;
  uint uVar2;
  UInt32 MyNumber;
  PDISASM pMyDisasm_local;
  
  (pMyDisasm->Operand1).OpType = 0x20000;
  (pMyDisasm->Operand1).Registers.type = 1;
  (pMyDisasm->Operand1).Registers.gpr = 1;
  (pMyDisasm->Operand2).OpType = 0x8040000;
  if ((pMyDisasm->Reserved_).OperandSize == 0x40) {
    iVar1 = Security(5,pMyDisasm);
    if (iVar1 == 0) {
      return;
    }
    (pMyDisasm->Reserved_).ImmediatSize = 0x20;
    (pMyDisasm->Operand1).OpSize = 0x40;
    (pMyDisasm->Operand2).OpSize = 0x20;
    uVar2 = *(uint *)((pMyDisasm->Reserved_).EIP_ + 1);
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand2).OpMnemonic,"%.16llX",(ulong)uVar2);
    (pMyDisasm->Instruction).Immediat = (ulong)uVar2;
    if ((pMyDisasm->Reserved_).REX.B_ == '\x01') {
      strcpy((pMyDisasm->Operand1).OpMnemonic,Registers64Bits[8]);
    }
    else {
      strcpy((pMyDisasm->Operand1).OpMnemonic,Registers64Bits[0]);
    }
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 5;
  }
  else if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
    iVar1 = Security(5,pMyDisasm);
    if (iVar1 == 0) {
      return;
    }
    (pMyDisasm->Reserved_).ImmediatSize = 0x20;
    (pMyDisasm->Operand1).OpSize = 0x20;
    (pMyDisasm->Operand2).OpSize = 0x20;
    uVar2 = *(uint *)((pMyDisasm->Reserved_).EIP_ + 1);
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand2).OpMnemonic,"%.8X",(ulong)uVar2);
    (pMyDisasm->Instruction).Immediat = (ulong)uVar2;
    if ((pMyDisasm->Reserved_).REX.B_ == '\x01') {
      strcpy((pMyDisasm->Operand1).OpMnemonic,Registers32Bits[8]);
    }
    else {
      strcpy((pMyDisasm->Operand1).OpMnemonic,Registers32Bits[0]);
    }
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 5;
  }
  else {
    iVar1 = Security(3,pMyDisasm);
    if (iVar1 == 0) {
      return;
    }
    (pMyDisasm->Reserved_).ImmediatSize = 0x10;
    (pMyDisasm->Operand1).OpSize = 0x10;
    (pMyDisasm->Operand2).OpSize = 0x10;
    uVar2 = (uint)*(ushort *)((pMyDisasm->Reserved_).EIP_ + 1);
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand2).OpMnemonic,"%.8X",(ulong)uVar2);
    (pMyDisasm->Instruction).Immediat = (ulong)uVar2;
    if ((pMyDisasm->Reserved_).REX.B_ == '\x01') {
      strcpy((pMyDisasm->Operand1).OpMnemonic,Registers16Bits[8]);
    }
    else {
      strcpy((pMyDisasm->Operand1).OpMnemonic,Registers16Bits[0]);
    }
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 3;
  }
  if ((pMyDisasm->Prefix).LockPrefix == '\x01') {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  return;
}

Assistant:

void __bea_callspec__ eAX_Iv(PDISASM pMyDisasm)
{
    UInt32 MyNumber;
    pMyDisasm->Operand1.OpType = REGISTER_TYPE;pMyDisasm->Operand1.Registers.type = GENERAL_REG;
    pMyDisasm->Operand1.Registers.gpr = REG0;
    pMyDisasm->Operand2.OpType = CONSTANT_TYPE+ABSOLUTE_;
    if (GV.OperandSize == 64) {
      if (!Security(5, pMyDisasm)) return;
      GV.ImmediatSize = 32;
      pMyDisasm->Operand1.OpSize = 64;
      pMyDisasm->Operand2.OpSize = 32;
      MyNumber = *((UInt32*) (GV.EIP_+1));
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand2.OpMnemonic,"%.16llX",(Int64) MyNumber);
      #endif
      pMyDisasm->Instruction.Immediat = MyNumber;
       if (GV.REX.B_ == 1) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers64Bits[0+8]);
          #endif
      }
      else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers64Bits[0]);
          #endif
      }
      GV.EIP_+= 5;
    }
    else if (GV.OperandSize == 32) {
      if (!Security(5, pMyDisasm)) return;
      GV.ImmediatSize = 32;
      pMyDisasm->Operand1.OpSize = 32;
      pMyDisasm->Operand2.OpSize = 32;
      MyNumber = *((UInt32*) (GV.EIP_+1));
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand2.OpMnemonic,"%.8X",(Int64) MyNumber);
      #endif
      pMyDisasm->Instruction.Immediat = MyNumber;
       if (GV.REX.B_ == 1) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers32Bits[0+8]);
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers32Bits[0]);
        #endif
      }
      GV.EIP_+= 5;
    }
    else {
      if (!Security(3, pMyDisasm)) return;
      GV.ImmediatSize = 16;
      pMyDisasm->Operand1.OpSize = 16;
      pMyDisasm->Operand2.OpSize = 16;
      MyNumber = *((UInt16*) (GV.EIP_+1));
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand2.OpMnemonic,"%.8X", (Int64) MyNumber);
      #endif
      pMyDisasm->Instruction.Immediat = MyNumber;
       if (GV.REX.B_ == 1) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers16Bits[0+8]);
          #endif
      }
      else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers16Bits[0]);
          #endif
      }
      GV.EIP_+= 3;
    }
    if (pMyDisasm->Prefix.LockPrefix == InUsePrefix) {
      GV.ERROR_OPCODE = UD_;
    }
}